

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Table_NumDeletedRegression_Test::~Table_NumDeletedRegression_Test
          (Table_NumDeletedRegression_Test *this)

{
  Table_NumDeletedRegression_Test *this_local;
  
  ~Table_NumDeletedRegression_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Table, NumDeletedRegression) {
  IntTable t;
  t.emplace(0);
  t.erase(t.find(0));
  // construct over a deleted slot.
  t.emplace(0);
  t.clear();
}